

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.h
# Opt level: O0

void __thiscall llvm::SmallPtrSetImplBase::clear(SmallPtrSetImplBase *this)

{
  bool bVar1;
  size_type sVar2;
  SmallPtrSetImplBase *this_local;
  
  DebugEpochBase::incrementEpoch((DebugEpochBase *)this);
  bVar1 = isSmall(this);
  if (!bVar1) {
    sVar2 = size(this);
    if ((sVar2 << 2 < this->CurArraySize) && (0x20 < this->CurArraySize)) {
      shrink_and_clear(this);
      return;
    }
    memset(this->CurArray,0xff,(ulong)this->CurArraySize << 3);
  }
  this->NumNonEmpty = 0;
  this->NumTombstones = 0;
  return;
}

Assistant:

void clear() {
    incrementEpoch();
    // If the capacity of the array is huge, and the # elements used is small,
    // shrink the array.
    if (!isSmall()) {
      if (size() * 4 < CurArraySize && CurArraySize > 32)
        return shrink_and_clear();
      // Fill the array with empty markers.
      memset(CurArray, -1, CurArraySize * sizeof(void *));
    }

    NumNonEmpty = 0;
    NumTombstones = 0;
  }